

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void move_sel_forward_back_proc
               (Am_Object *inter,int param_2,int param_3,Am_Object param_4,Am_Input_Char ic)

{
  bool bVar1;
  Am_Which_Sel_Direction dir;
  Am_Object widget;
  Am_Object AStack_28;
  Am_Object local_20;
  
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    dir = check_sel_move_direction(inter,ic);
    Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)inter);
    Am_Object::Am_Object(&AStack_28,&Am_No_Object);
    do_move_forward_back(inter,&local_20,dir,((uint)ic & 0x30000) != 0,&AStack_28);
    Am_Object::~Am_Object(&AStack_28);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, move_sel_forward_back,
                 (Am_Object inter, int /* mouse_x */, int /* mouse_y */,
                  Am_Object /* ref_obj */, Am_Input_Char ic))
{
  if (inter.Valid()) {
    bool extend = ic.shift || ic.control;
    Am_Which_Sel_Direction dir = check_sel_move_direction(inter, ic);
    Am_Object widget = inter.Get_Owner();
    do_move_forward_back(inter, widget, dir, extend, Am_No_Object);
  }
}